

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>
::operator()(QuantileCompare<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  bool bVar1;
  RESULT_TYPE *right;
  RESULT_TYPE *this_00;
  RESULT_TYPE rval;
  RESULT_TYPE lval;
  RESULT_TYPE local_30;
  RESULT_TYPE local_20;
  
  local_20 = MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>::operator()
                       (this->accessor_l,lhs);
  local_30 = MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>::operator()
                       (this->accessor_r,rhs);
  if (this->desc == true) {
    this_00 = &local_20;
    right = &local_30;
  }
  else {
    this_00 = &local_30;
    right = &local_20;
  }
  bVar1 = interval_t::operator>(this_00,right);
  return bVar1;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}